

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::_::Tuple<>_> * __thiscall
kj::_::NullableValue<kj::_::Tuple<>_>::operator=
          (NullableValue<kj::_::Tuple<>_> *this,NullableValue<kj::_::Tuple<>_> *other)

{
  Tuple<> *params;
  NullableValue<kj::_::Tuple<>_> *other_local;
  NullableValue<kj::_::Tuple<>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::_::Tuple<>>((Tuple<> *)&this->field_0x1);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::_::Tuple<>>((Tuple<> *)&other->field_0x1);
      ctor<kj::_::Tuple<>,kj::_::Tuple<>>((Tuple<> *)&this->field_0x1,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }